

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QSslError>::insert
          (QMovableArrayOps<QSslError> *this,qsizetype i,qsizetype n,parameter_type t)

{
  QSslError **ppQVar1;
  qsizetype *pqVar2;
  long in_FS_OFFSET;
  bool bVar3;
  QSslError copy;
  Inserter local_60;
  QSslError local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.d._M_t.super___uniq_ptr_impl<QSslErrorPrivate,_std::default_delete<QSslErrorPrivate>_>.
  _M_t.super__Tuple_impl<0UL,_QSslErrorPrivate_*,_std::default_delete<QSslErrorPrivate>_>.
  super__Head_base<0UL,_QSslErrorPrivate_*,_false>._M_head_impl =
       (unique_ptr<QSslErrorPrivate,_std::default_delete<QSslErrorPrivate>_>)&DAT_aaaaaaaaaaaaaaaa;
  QSslError::QSslError(&local_38,t);
  bVar3 = (this->super_QGenericArrayOps<QSslError>).super_QArrayDataPointer<QSslError>.size != 0;
  QArrayDataPointer<QSslError>::detachAndGrow
            ((QArrayDataPointer<QSslError> *)this,(uint)(i == 0 && bVar3),n,(QSslError **)0x0,
             (QArrayDataPointer<QSslError> *)0x0);
  if (i == 0 && bVar3) {
    while (bVar3 = n != 0, n = n + -1, bVar3) {
      QSslError::QSslError
                ((this->super_QGenericArrayOps<QSslError>).super_QArrayDataPointer<QSslError>.ptr +
                 -1,&local_38);
      ppQVar1 = &(this->super_QGenericArrayOps<QSslError>).super_QArrayDataPointer<QSslError>.ptr;
      *ppQVar1 = *ppQVar1 + -1;
      pqVar2 = &(this->super_QGenericArrayOps<QSslError>).super_QArrayDataPointer<QSslError>.size;
      *pqVar2 = *pqVar2 + 1;
    }
  }
  else {
    Inserter::Inserter(&local_60,(QArrayDataPointer<QSslError> *)this,i,n);
    Inserter::insertFill(&local_60,&local_38,n);
    Inserter::~Inserter(&local_60);
  }
  QSslError::~QSslError(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void insert(qsizetype i, qsizetype n, parameter_type t)
    {
        T copy(t);

        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, n, nullptr, nullptr);
        Q_ASSERT((pos == Data::GrowsAtBeginning && this->freeSpaceAtBegin() >= n) ||
                 (pos == Data::GrowsAtEnd && this->freeSpaceAtEnd() >= n));

        if (growsAtBegin) {
            // copy construct items in reverse order at the begin
            Q_ASSERT(this->freeSpaceAtBegin() >= n);
            while (n--) {
                new (this->begin() - 1) T(copy);
                --this->ptr;
                ++this->size;
            }
        } else {
            Inserter(this, i, n).insertFill(copy, n);
        }
    }